

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O3

try_get_result_type * __thiscall
unodb::
olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
::try_get(try_get_result_type *__return_storage_ptr__,
         olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
         *this,art_key_type k)

{
  atomic<long> *paVar1;
  byte bVar2;
  optimistic_lock *poVar3;
  undefined1 this_00 [8];
  version_type vVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  size_t __n;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
  *this_01;
  ulong uVar12;
  void *__src;
  critical_section_policy<std::uint8_t> *ptr;
  find_result fVar13;
  uint64_t local_68;
  void *local_60;
  undefined1 local_58 [8];
  read_critical_section parent_critical_section;
  undefined1 local_40 [8];
  read_critical_section node_critical_section;
  
  uVar8 = k.field_0._8_8_;
  local_60 = k.field_0._0_8_;
  optimistic_lock::try_read_lock((optimistic_lock *)local_58);
  if (local_58 != (undefined1  [8])0x0) {
    uVar10 = (this->root).value._M_i.tagged_ptr;
    if (uVar10 == 0) {
      olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
      ::try_get();
      goto LAB_0011e061;
    }
    bVar5 = optimistic_lock::check
                      ((optimistic_lock *)local_58,(version_type)parent_critical_section.lock);
    if (bVar5) {
      optimistic_lock::try_read_lock((optimistic_lock *)local_40);
      uVar9 = uVar8;
      __src = local_60;
      vVar4.version = (version_tag_type)__return_storage_ptr__;
      if (local_40 == (undefined1  [8])0x0) {
LAB_0011e0d0:
        bVar5 = false;
        __return_storage_ptr__ = __return_storage_ptr__;
      }
      else {
        do {
          parent_critical_section.version.version = vVar4.version;
          this_01 = (basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                     *)(uVar10 & 0xfffffffffffffff8);
          if ((((atomic<long> *)((long)local_58 + 8))->super___atomic_base<long>)._M_i < 1)
          goto LAB_0011e112;
          poVar3 = *(optimistic_lock **)local_58;
          LOCK();
          paVar1 = (atomic<long> *)((long)local_58 + 8);
          lVar11 = (paVar1->super___atomic_base<long>)._M_i;
          (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
          UNLOCK();
          if (parent_critical_section.lock != poVar3) {
            if (lVar11 < 1) goto LAB_0011e0f3;
            local_58 = (undefined1  [8])0x0;
            break;
          }
          if (lVar11 < 1) goto LAB_0011e0f3;
          local_58 = (undefined1  [8])0x0;
          if ((uVar10 & 7) == 0) {
            uVar9 = (ulong)*(uint *)&this_01->k_prefix;
            uVar10 = uVar9;
            if (uVar8 <= uVar9) {
              uVar10 = uVar8;
            }
            iVar7 = bcmp(local_60,&this_01->children_count,uVar10);
            __return_storage_ptr__ = (try_get_result_type *)parent_critical_section.version;
            if (iVar7 == 0 && uVar9 == uVar8) {
              uVar6 = *(uint *)((long)&this_01->k_prefix + 4);
              if ((((atomic<long> *)((long)local_40 + 8))->super___atomic_base<long>)._M_i < 1)
              goto LAB_0011e112;
              poVar3 = *(optimistic_lock **)local_40;
              LOCK();
              paVar1 = (atomic<long> *)((long)local_40 + 8);
              lVar11 = (paVar1->super___atomic_base<long>)._M_i;
              (paVar1->super___atomic_base<long>)._M_i =
                   (paVar1->super___atomic_base<long>)._M_i + -1;
              UNLOCK();
              if (node_critical_section.lock == poVar3) {
                if (lVar11 < 1) goto LAB_0011e0f3;
                ptr = &this_01->children_count + uVar8;
                local_40 = (undefined1  [8])0x0;
                detail::qsbr_ptr_base::register_active_ptr(ptr);
                *(critical_section_policy<std::uint8_t> **)__return_storage_ptr__ = ptr;
                *(ulong *)((long)__return_storage_ptr__ + 8) = (ulong)uVar6;
                *(undefined1 *)((long)__return_storage_ptr__ + 0x10) = 1;
                *(undefined1 *)((long)__return_storage_ptr__ + 0x18) = 1;
                detail::qsbr_ptr_base::unregister_active_ptr((void *)0x0);
                goto LAB_0011e058;
              }
            }
            else {
              if ((((atomic<long> *)((long)local_40 + 8))->super___atomic_base<long>)._M_i < 1)
              goto LAB_0011e112;
              poVar3 = *(optimistic_lock **)local_40;
              LOCK();
              paVar1 = (atomic<long> *)((long)local_40 + 8);
              lVar11 = (paVar1->super___atomic_base<long>)._M_i;
              (paVar1->super___atomic_base<long>)._M_i =
                   (paVar1->super___atomic_base<long>)._M_i + -1;
              UNLOCK();
              if (node_critical_section.lock == poVar3) goto LAB_0011e03c;
            }
LAB_0011e0c3:
            if (lVar11 < 1) {
LAB_0011e0f3:
              __assert_fail("old_value > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                            ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
            }
            local_40 = (undefined1  [8])0x0;
            __return_storage_ptr__ = (try_get_result_type *)parent_critical_section.version.version;
            goto LAB_0011e0d0;
          }
          bVar2 = *(byte *)((long)&this_01->k_prefix + 7);
          if (7 < bVar2) {
            __assert_fail("result <= key_prefix_capacity",
                          "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                          ,0x298,
                          "key_prefix_size unodb::detail::key_prefix<unodb::detail::basic_art_key<std::span<const std::byte>>, unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::critical_section_policy>::length() const [ArtKey = unodb::detail::basic_art_key<std::span<const std::byte>>, CriticalSectionPolicy = unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::critical_section_policy]"
                         );
          }
          local_68 = 0;
          __n = 8;
          if (uVar9 < 8) {
            __n = uVar9;
          }
          memcpy(&local_68,__src,__n);
          uVar6 = detail::
                  key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
                  ::get_shared_length((key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
                                       *)&(this_01->k_prefix).f,local_68);
          if (uVar6 < bVar2) {
LAB_0011df3a:
            if ((((atomic<long> *)((long)local_40 + 8))->super___atomic_base<long>)._M_i < 1) {
LAB_0011e112:
              __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                            ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
            }
            poVar3 = *(optimistic_lock **)local_40;
            LOCK();
            paVar1 = (atomic<long> *)((long)local_40 + 8);
            lVar11 = (paVar1->super___atomic_base<long>)._M_i;
            (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if (node_critical_section.lock != poVar3) goto LAB_0011e0c3;
LAB_0011e03c:
            if (lVar11 < 1) goto LAB_0011e0f3;
            local_40 = (undefined1  [8])0x0;
            *(undefined1 *)(parent_critical_section.version.version + 0x10) = 0;
            bVar5 = true;
            __return_storage_ptr__ = (try_get_result_type *)parent_critical_section.version.version;
            goto LAB_0011e054;
          }
          if (uVar6 != bVar2) {
            __assert_fail("shared_key_prefix_length == key_prefix_length",
                          "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                          ,0x6d4,
                          "typename olc_db<Key, Value>::try_get_result_type unodb::olc_db<std::span<const std::byte>, std::span<const std::byte>>::try_get(art_key_type) const [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
                         );
          }
          uVar12 = (ulong)bVar2;
          if (uVar9 < uVar12) {
LAB_0011e0d4:
            __assert_fail("num_bytes <= key.size_bytes()",
                          "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal.hpp"
                          ,0xc0,
                          "void unodb::detail::basic_art_key<std::span<const std::byte>>::shift_right(const std::size_t) [KeyType = std::span<const std::byte>]"
                         );
          }
          fVar13 = detail::
                   basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                   ::find_child(this_01,(node_type)uVar10 & (I256|I48),
                                *(byte *)((long)__src + uVar12));
          this_00 = local_40;
          if (fVar13.second ==
              (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *
              )0x0) goto LAB_0011df3a;
          uVar10 = ((fVar13.second)->value)._M_i.tagged_ptr;
          local_58 = local_40;
          local_40 = (undefined1  [8])0x0;
          parent_critical_section.lock = node_critical_section.lock;
          if (uVar9 == uVar12) goto LAB_0011e0d4;
          bVar5 = optimistic_lock::check
                            ((optimistic_lock *)this_00,(version_type)node_critical_section.lock);
          if (!bVar5) {
            local_58 = (undefined1  [8])0x0;
            *(undefined1 *)(parent_critical_section.version.version + 0x18) = 0;
            __return_storage_ptr__ = (try_get_result_type *)parent_critical_section.version;
            goto LAB_0011e058;
          }
          optimistic_lock::read_critical_section::~read_critical_section
                    ((read_critical_section *)local_40);
          optimistic_lock::try_read_lock((optimistic_lock *)local_40);
          uVar9 = uVar9 + ~uVar12;
          __src = (void *)((long)__src + uVar12 + 1);
          vVar4 = parent_critical_section.version;
        } while ((__atomic_base<unsigned_long>)local_40 != (__atomic_base<unsigned_long>)0x0);
        bVar5 = false;
        __return_storage_ptr__ = (try_get_result_type *)parent_critical_section.version.version;
      }
LAB_0011e054:
      (__return_storage_ptr__->
      super__Optional_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_false,_false>).
      _M_payload.
      super__Optional_payload<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_true,_false,_false>
      .super__Optional_payload_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_>.
      _M_engaged = bVar5;
LAB_0011e058:
      optimistic_lock::read_critical_section::~read_critical_section
                ((read_critical_section *)local_40);
      goto LAB_0011e061;
    }
    local_58 = (undefined1  [8])0x0;
  }
  (__return_storage_ptr__->
  super__Optional_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_false,_false>).
  _M_payload.
  super__Optional_payload<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_true,_false,_false>
  .super__Optional_payload_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_>._M_engaged =
       false;
LAB_0011e061:
  optimistic_lock::read_critical_section::~read_critical_section((read_critical_section *)local_58);
  return __return_storage_ptr__;
}

Assistant:

typename olc_db<Key, Value>::try_get_result_type olc_db<Key, Value>::try_get(
    art_key_type k) const noexcept {
  auto parent_critical_section = root_pointer_lock.try_read_lock();
  if (UNODB_DETAIL_UNLIKELY(parent_critical_section.must_restart())) {
    // LCOV_EXCL_START
    spin_wait_loop_body();
    return {};
    // LCOV_EXCL_STOP
  }

  detail::olc_node_ptr node{root.load()};  // load root into [node].

  if (UNODB_DETAIL_UNLIKELY(node == nullptr)) {  // special path if empty tree.
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock())) {
      // LCOV_EXCL_START
      spin_wait_loop_body();
      return {};
      // LCOV_EXCL_STOP
    }
    // return an empty result (breaks out of caller's while(true) loop)
    return std::make_optional<get_result>(std::nullopt);
  }

  // A check() is required before acting on [node] by taking the lock.
  if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.check())) {
    // LCOV_EXCL_START
    spin_wait_loop_body();
    return {};
    // LCOV_EXCL_STOP
  }

  auto remaining_key{k};

  while (true) {
    // Lock version chaining (node and parent)
    auto node_critical_section = node_ptr_lock(node).try_read_lock();
    if (UNODB_DETAIL_UNLIKELY(node_critical_section.must_restart())) return {};
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    const auto node_type = node.type();

    if (node_type == node_type::LEAF) {
      const auto* const leaf{node.ptr<leaf_type*>()};
      if (leaf->matches(k)) {
        const auto val_view{leaf->get_value_view()};
        if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
          return {};  // LCOV_EXCL_LINE
        return qsbr_ptr_span<const std::byte>{val_view};
      }
      if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
        return {};  // LCOV_EXCL_LINE
      return std::make_optional<get_result>(std::nullopt);
    }

    auto* const inode{node.ptr<inode_type*>()};
    const auto& key_prefix{inode->get_key_prefix()};
    const auto key_prefix_length{key_prefix.length()};
    const auto shared_key_prefix_length{
        key_prefix.get_shared_length(remaining_key)};

    if (shared_key_prefix_length < key_prefix_length) {
      if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
        return {};  // LCOV_EXCL_LINE
      return std::make_optional<get_result>(std::nullopt);
    }

    UNODB_DETAIL_ASSERT(shared_key_prefix_length == key_prefix_length);

    remaining_key.shift_right(key_prefix_length);

    const auto* const child_in_parent{
        inode->find_child(node_type, remaining_key[0]).second};

    if (child_in_parent == nullptr) {
      if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
        return {};  // LCOV_EXCL_LINE
      return std::make_optional<get_result>(std::nullopt);
    }

    const auto child = child_in_parent->load();

    parent_critical_section = std::move(node_critical_section);
    node = child;
    remaining_key.shift_right(1);

    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.check())) return {};
  }
}